

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_type.cpp
# Opt level: O3

spv_result_t
spvtools::val::anon_unknown_2::ValidateTensorDim(ValidationState_t *_,Instruction *inst)

{
  spv_result_t sVar1;
  bool bVar2;
  uint id;
  uint32_t uVar3;
  Instruction *pIVar4;
  DiagnosticStream *pDVar5;
  long lVar6;
  char *pcVar7;
  uint64_t dim_value;
  char *local_230;
  string local_228;
  char *local_208;
  DiagnosticStream local_200;
  
  id = Instruction::GetOperandAs<unsigned_int>(inst,1);
  pIVar4 = ValidationState_t::FindDef(_,id);
  if (((pIVar4 == (Instruction *)0x0) ||
      (bVar2 = ValidationState_t::IsIntScalarType(_,(pIVar4->inst_).type_id), !bVar2)) ||
     (uVar3 = ValidationState_t::GetBitWidth(_,(pIVar4->inst_).type_id), uVar3 != 0x20)) {
    ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_ID,inst);
    local_230 = spvOpcodeString((uint)(inst->inst_).opcode);
    pDVar5 = DiagnosticStream::operator<<(&local_200,&local_230);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar5," Dim <id> ",10);
    ValidationState_t::getIdName_abi_cxx11_(&local_228,_,id);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pDVar5,local_228._M_dataplus._M_p,local_228._M_string_length);
    pcVar7 = " is not a 32-bit integer.";
    lVar6 = 0x19;
  }
  else {
    bVar2 = ValidationState_t::EvalConstantValUint64(_,id,(uint64_t *)&local_230);
    if (!bVar2) {
      return SPV_SUCCESS;
    }
    if ((char *)0xfffffffffffffffa < local_230 + -6) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_ID,inst);
    local_208 = spvOpcodeString((uint)(inst->inst_).opcode);
    pDVar5 = DiagnosticStream::operator<<(&local_200,&local_208);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar5," Dim <id> ",10);
    ValidationState_t::getIdName_abi_cxx11_(&local_228,_,id);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pDVar5,local_228._M_dataplus._M_p,local_228._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pDVar5," must be between 1 and ",0x17);
    std::ostream::_M_insert<unsigned_long>((ulong)pDVar5);
    pcVar7 = ".";
    lVar6 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar5,pcVar7,lVar6);
  sVar1 = pDVar5->error_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  DiagnosticStream::~DiagnosticStream(&local_200);
  return sVar1;
}

Assistant:

spv_result_t ValidateTensorDim(ValidationState_t& _, const Instruction* inst) {
  const auto dim_index = 1;
  const auto dim_id = inst->GetOperandAs<uint32_t>(dim_index);
  const auto dim = _.FindDef(dim_id);
  if (!dim || !_.IsIntScalarType(dim->type_id()) ||
      _.GetBitWidth(dim->type_id()) != 32) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << spvOpcodeString(inst->opcode()) << " Dim <id> "
           << _.getIdName(dim_id) << " is not a 32-bit integer.";
  }

  constexpr uint32_t max_tensor_dim = 5;

  uint64_t dim_value;
  if (_.EvalConstantValUint64(dim_id, &dim_value)) {
    if (dim_value == 0 || dim_value > max_tensor_dim) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << spvOpcodeString(inst->opcode()) << " Dim <id> "
             << _.getIdName(dim_id) << " must be between 1 and "
             << max_tensor_dim << ".";
    }
  }

  return SPV_SUCCESS;
}